

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O3

int Nwk_ManGraphListLength(Nwk_Grf_t *p,int List)

{
  int iVar1;
  int iVar2;
  Nwk_Vrt_t *pNVar3;
  
  iVar2 = 0;
  if ((List != 0) && (pNVar3 = p->pVerts[List], iVar2 = 0, pNVar3 != (Nwk_Vrt_t *)0x0)) {
    iVar1 = 1;
    do {
      iVar2 = iVar1;
      if ((long)pNVar3->iNext == 0) {
        return iVar2;
      }
      pNVar3 = p->pVerts[pNVar3->iNext];
      iVar1 = iVar2 + 1;
    } while (pNVar3 != (Nwk_Vrt_t *)0x0);
  }
  return iVar2;
}

Assistant:

int Nwk_ManGraphListLength( Nwk_Grf_t * p, int List )
{
    Nwk_Vrt_t * pThis;
    int fVerbose = 0;
    int Counter = 0;
    Nwk_ListForEachVertex( p, List, pThis )
    {
        if ( fVerbose && Counter < 20 )
            printf( "%d ", p->pVerts[pThis->pEdges[0]]->nEdges );
        Counter++;
    }
    if ( fVerbose )
        printf( "\n" );
    return Counter;
}